

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

int __thiscall TasGrid::RuleWavelet::getParent(RuleWavelet *this,int point)

{
  int point_local;
  RuleWavelet *this_local;
  
  if (this->order == 1) {
    if (point < 3) {
      return -1;
    }
    if (point < 5) {
      return -2;
    }
  }
  else {
    if (point < 5) {
      return -1;
    }
    if (point < 9) {
      return -2;
    }
  }
  return (point + 1) / 2;
}

Assistant:

int RuleWavelet::getParent(int point) const{
    // Returns the parent of a given node.
    // Miro: this is a hack, -1 indicates no parent, >= 0 indicates the parent, -2 indicates all nodes on level 0
    if (order == 1){
        if(point <= 2) return -1;
        if(point <= 4) return -2;
    }else{
        if(point <= 4) return -1;
        if(point <= 8) return -2;
    }
    return (point+1)/2;
}